

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall
nonius::standard_reporter::do_measurement_start
          (standard_reporter *this,
          execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *plan)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  char *this_00;
  string local_38;
  
  if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &(this->super_reporter).os;
    pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
    *(undefined8 *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 8) = 7;
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
      *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) =
           *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) & 0xfffffefb;
      if (this->summary == false) {
        if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_0013f79c;
        pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar2,"collecting ",0xb);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)pbVar2,this->n_samples);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," samples, ",10);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,plan->iterations_per_sample);
        this_00 = " iterations each, in estimated ";
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," iterations each, in estimated ",0x1f);
        detail::pretty_duration_abi_cxx11_
                  (&local_38,(detail *)this_00,(fp_seconds)(plan->estimated_duration).__r);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_38._M_dataplus._M_p,local_38._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      return;
    }
  }
LAB_0013f79c:
  std::__throw_bad_function_call();
}

Assistant:

NONIUS_NOEXCEPT override {
        return "operation not supported for this parameter type";
    }